

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

double __thiscall
TxConfirmStats::EstimateMedianVal
          (TxConfirmStats *this,int confTarget,double sufficientTxVal,double successBreakPoint,
          uint nBlockHeight,EstimationResult *result)

{
  double dVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pdVar9;
  pointer piVar10;
  double dVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  Level LVar15;
  double *pdVar16;
  Level LVar17;
  double *pdVar18;
  ulong uVar19;
  int iVar20;
  Level LVar21;
  double *pdVar22;
  int iVar23;
  uint uVar24;
  double *pdVar25;
  Level LVar26;
  Level LVar27;
  uint confct;
  uint uVar28;
  long in_FS_OFFSET;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  string_view source_file;
  string_view logging_function;
  Level local_110;
  double local_c0;
  float failed_within_target_perc;
  float passed_within_target_perc;
  double median;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double adStack_50 [2];
  int confTarget_local;
  long local_38;
  
  pdVar22 = (double *)(ulong)(uint)confTarget;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = this->scale;
  pdVar3 = (this->buckets->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar4 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar5 = (this->unconfTxs).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = -1.0;
  dStack_70 = -1.0;
  local_68 = 0.0;
  dStack_60 = 0.0;
  local_58 = 0.0;
  adStack_50[0] = 0.0;
  local_a8 = -1.0;
  dStack_a0 = -1.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  iVar23 = ((confTarget + uVar2) - 1) / uVar2 - 1;
  pvVar6 = (this->confAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = (this->failAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar8 = (this->confAvg).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar9 = (this->txCtAvg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = this->decay;
  dVar41 = 0.0;
  dVar31 = 0.0;
  dVar32 = 0.0;
  dVar11 = 0.0;
  dVar39 = 0.0;
  dVar37 = 0.0;
  dVar33 = 0.0;
  dVar35 = 0.0;
  bVar14 = true;
  piVar10 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar13 = true;
  bVar12 = 0;
  iVar20 = 0;
  LVar27 = (int)((ulong)((long)(this->buckets->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3) >> 3) -
           Debug;
  LVar15 = LVar27;
  LVar21 = LVar27;
  local_110 = LVar27;
  for (LVar26 = LVar27; -1 < (int)LVar26; LVar26 = LVar26 - Debug) {
    if (bVar14) {
      LVar21 = LVar26;
    }
    pdVar22 = (double *)(ulong)LVar26;
    dVar39 = dVar39 + pdVar9[(long)pdVar22];
    uVar24 = nBlockHeight - confTarget;
    for (uVar28 = confTarget; uVar28 < (int)(((long)pvVar8 - (long)pvVar6) / 0x18) * uVar2;
        uVar28 = uVar28 + 1) {
      iVar20 = iVar20 + *(int *)(*(long *)&pvVar5[(ulong)uVar24 %
                                                  (((long)pvVar4 - (long)pvVar5) / 0x18 &
                                                  0xffffffffU)].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data + (long)pdVar22 * 4);
      uVar24 = uVar24 - 1;
    }
    if (bVar14) {
      bVar14 = false;
    }
    dVar34 = dVar33 + *(double *)
                       (*(long *)&pvVar6[iVar23].super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + (long)pdVar22 * 8);
    dVar36 = dVar35 + pdVar9[(long)pdVar22];
    dVar38 = dVar37 + *(double *)
                       (*(long *)&pvVar7[iVar23].super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data + (long)pdVar22 * 8);
    iVar20 = iVar20 + piVar10[(long)pdVar22];
    dVar33 = dVar34;
    dVar35 = dVar36;
    dVar37 = dVar38;
    if (sufficientTxVal / (1.0 - dVar1) <= dVar39) {
      dVar40 = (double)iVar20;
      if (successBreakPoint <= dVar34 / (dVar36 + dVar38 + dVar40)) {
        local_88 = 0.0;
        dStack_80 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        local_a8 = -1.0;
        dVar33 = 0.0;
        dVar35 = 0.0;
        iVar20 = 0;
        dVar37 = 0.0;
        bVar13 = true;
        dStack_a0 = -1.0;
        pdVar16 = &local_68;
        pdVar22 = &local_58;
        pdVar25 = adStack_50;
        bVar14 = true;
        bVar12 = 1;
        pdVar18 = &dStack_60;
        dVar31 = dVar38;
        dVar32 = dVar40;
        dVar41 = dVar34;
        LVar27 = LVar26;
        dVar11 = dVar36;
        local_110 = LVar21;
      }
      else {
        dVar39 = 0.0;
        if (!bVar13) goto LAB_0024dd89;
        LVar17 = LVar26;
        LVar15 = LVar21;
        if (LVar26 < LVar21) {
          LVar17 = LVar21;
          LVar15 = LVar26;
        }
        if (LVar15 != Trace) {
          dVar39 = pdVar3[LVar15 - Debug];
        }
        dStack_a0 = pdVar3[LVar17];
        bVar13 = false;
        pdVar16 = &local_98;
        pdVar22 = &local_88;
        pdVar25 = &dStack_80;
        pdVar18 = &dStack_90;
        local_a8 = dVar39;
      }
      *pdVar16 = dVar34;
      *pdVar18 = dVar36;
      *pdVar22 = dVar40;
      *pdVar25 = dVar38;
      dVar39 = 0.0;
    }
LAB_0024dd89:
    LVar15 = LVar26;
  }
  median = -1.0;
  LVar26 = LVar27;
  if (LVar27 < local_110) {
    LVar26 = local_110;
    local_110 = LVar27;
  }
  dVar1 = 0.0;
  for (LVar27 = local_110; pdVar16 = (double *)(ulong)LVar27, LVar27 <= LVar26;
      LVar27 = LVar27 + Debug) {
    dVar1 = dVar1 + pdVar9[(long)pdVar16];
    pdVar22 = pdVar16;
  }
  uVar19 = CONCAT71((int7)((ulong)pdVar22 >> 8),dVar1 != 0.0);
  LVar27 = (Level)uVar19;
  if ((bool)(bVar12 & dVar1 != 0.0)) {
    dVar1 = dVar1 * 0.5;
    LVar17 = local_110;
    while( true ) {
      LVar27 = (Level)uVar19;
      uVar19 = (ulong)LVar17;
      if (LVar26 < LVar17) break;
      dVar39 = pdVar9[uVar19];
      if (dVar1 <= dVar39) {
        median = (this->m_feerate_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19] / dVar39;
        LVar27 = LVar17;
        break;
      }
      dVar1 = dVar1 - dVar39;
      LVar17 = LVar17 + Debug;
    }
    if (local_110 == Trace) {
      uVar29 = 0;
      uVar30 = 0;
    }
    else {
      uVar29 = SUB84(pdVar3[local_110 - Debug],0);
      uVar30 = (undefined4)((ulong)pdVar3[local_110 - Debug] >> 0x20);
    }
    local_78 = (double)CONCAT44(uVar30,uVar29);
    dStack_70 = pdVar3[LVar26];
  }
  if ((bVar13) && (!bVar14)) {
    LVar26 = LVar15;
    if (LVar15 < LVar21) {
      LVar26 = LVar21;
      LVar21 = LVar15;
    }
    if (LVar21 == Trace) {
      uVar29 = 0;
      uVar30 = 0;
    }
    else {
      uVar29 = SUB84(pdVar3[LVar21 - Debug],0);
      uVar30 = (undefined4)((ulong)pdVar3[LVar21 - Debug] >> 0x20);
    }
    local_a8 = (double)CONCAT44(uVar30,uVar29);
    dStack_a0 = pdVar3[LVar26];
    local_88 = (double)iVar20;
    local_98 = dVar33;
    dStack_90 = dVar35;
    dStack_80 = dVar37;
  }
  passed_within_target_perc = 0.0;
  failed_within_target_perc = 0.0;
  dVar31 = dVar11 + dVar32 + dVar31;
  if ((dVar31 != 0.0) || (NAN(dVar31))) {
    passed_within_target_perc = (float)((dVar41 * 100.0) / dVar31);
  }
  dVar1 = dStack_90 + local_88 + dStack_80;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    failed_within_target_perc = (float)((local_98 * 100.0) / dVar1);
  }
  confTarget_local = confTarget;
  bVar14 = ::LogAcceptCategory((ulong)(nBlockHeight - confTarget),LVar27);
  if (bVar14) {
    local_c0 = successBreakPoint * 100.0;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
    ;
    source_file._M_len = 0x5f;
    logging_function._M_str = "EstimateMedianVal";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<int,double,double,double,double,double,float,double,double,double,double,double,double,float,double,double,double,double>
              (logging_function,source_file,0x18b,ESTIMATEFEE,Debug,
               (ConstevalFormatString<18U>)0x6a82d9,&confTarget_local,&local_c0,&this->decay,&median
               ,&local_78,&dStack_70,&passed_within_target_perc,&local_68,&dStack_60,&local_58,
               adStack_50,&local_a8,&dStack_a0,&failed_within_target_perc,&local_98,&dStack_90,
               &local_88,&dStack_80);
  }
  if (result != (EstimationResult *)0x0) {
    (result->pass).inMempool = local_58;
    (result->pass).leftMempool = adStack_50[0];
    (result->pass).withinTarget = local_68;
    (result->pass).totalConfirmed = dStack_60;
    (result->pass).start = local_78;
    (result->pass).end = dStack_70;
    (result->fail).start = local_a8;
    (result->fail).end = dStack_a0;
    (result->fail).withinTarget = local_98;
    (result->fail).totalConfirmed = dStack_90;
    (result->fail).inMempool = local_88;
    (result->fail).leftMempool = dStack_80;
    result->decay = this->decay;
    result->scale = this->scale;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return median;
  }
  __stack_chk_fail();
}

Assistant:

double TxConfirmStats::EstimateMedianVal(int confTarget, double sufficientTxVal,
                                         double successBreakPoint, unsigned int nBlockHeight,
                                         EstimationResult *result) const
{
    // Counters for a bucket (or range of buckets)
    double nConf = 0; // Number of tx's confirmed within the confTarget
    double totalNum = 0; // Total number of tx's that were ever confirmed
    int extraNum = 0;  // Number of tx's still in mempool for confTarget or longer
    double failNum = 0; // Number of tx's that were never confirmed but removed from the mempool after confTarget
    const int periodTarget = (confTarget + scale - 1) / scale;
    const int maxbucketindex = buckets.size() - 1;

    // We'll combine buckets until we have enough samples.
    // The near and far variables will define the range we've combined
    // The best variables are the last range we saw which still had a high
    // enough confirmation rate to count as success.
    // The cur variables are the current range we're counting.
    unsigned int curNearBucket = maxbucketindex;
    unsigned int bestNearBucket = maxbucketindex;
    unsigned int curFarBucket = maxbucketindex;
    unsigned int bestFarBucket = maxbucketindex;

    // We'll always group buckets into sets that meet sufficientTxVal --
    // this ensures that we're using consistent groups between different
    // confirmation targets.
    double partialNum = 0;

    bool foundAnswer = false;
    unsigned int bins = unconfTxs.size();
    bool newBucketRange = true;
    bool passing = true;
    EstimatorBucket passBucket;
    EstimatorBucket failBucket;

    // Start counting from highest feerate transactions
    for (int bucket = maxbucketindex; bucket >= 0; --bucket) {
        if (newBucketRange) {
            curNearBucket = bucket;
            newBucketRange = false;
        }
        curFarBucket = bucket;
        nConf += confAvg[periodTarget - 1][bucket];
        partialNum += txCtAvg[bucket];
        totalNum += txCtAvg[bucket];
        failNum += failAvg[periodTarget - 1][bucket];
        for (unsigned int confct = confTarget; confct < GetMaxConfirms(); confct++)
            extraNum += unconfTxs[(nBlockHeight - confct) % bins][bucket];
        extraNum += oldUnconfTxs[bucket];
        // If we have enough transaction data points in this range of buckets,
        // we can test for success
        // (Only count the confirmed data points, so that each confirmation count
        // will be looking at the same amount of data and same bucket breaks)

        if (partialNum < sufficientTxVal / (1 - decay)) {
            // the buckets we've added in this round aren't sufficient
            // so keep adding
            continue;
        } else {
            partialNum = 0; // reset for the next range we'll add

            double curPct = nConf / (totalNum + failNum + extraNum);

            // Check to see if we are no longer getting confirmed at the success rate
            if (curPct < successBreakPoint) {
                if (passing == true) {
                    // First time we hit a failure record the failed bucket
                    unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
                    unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
                    failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
                    failBucket.end = buckets[failMaxBucket];
                    failBucket.withinTarget = nConf;
                    failBucket.totalConfirmed = totalNum;
                    failBucket.inMempool = extraNum;
                    failBucket.leftMempool = failNum;
                    passing = false;
                }
                continue;
            }
            // Otherwise update the cumulative stats, and the bucket variables
            // and reset the counters
            else {
                failBucket = EstimatorBucket(); // Reset any failed bucket, currently passing
                foundAnswer = true;
                passing = true;
                passBucket.withinTarget = nConf;
                nConf = 0;
                passBucket.totalConfirmed = totalNum;
                totalNum = 0;
                passBucket.inMempool = extraNum;
                passBucket.leftMempool = failNum;
                failNum = 0;
                extraNum = 0;
                bestNearBucket = curNearBucket;
                bestFarBucket = curFarBucket;
                newBucketRange = true;
            }
        }
    }

    double median = -1;
    double txSum = 0;

    // Calculate the "average" feerate of the best bucket range that met success conditions
    // Find the bucket with the median transaction and then report the average feerate from that bucket
    // This is a compromise between finding the median which we can't since we don't save all tx's
    // and reporting the average which is less accurate
    unsigned int minBucket = std::min(bestNearBucket, bestFarBucket);
    unsigned int maxBucket = std::max(bestNearBucket, bestFarBucket);
    for (unsigned int j = minBucket; j <= maxBucket; j++) {
        txSum += txCtAvg[j];
    }
    if (foundAnswer && txSum != 0) {
        txSum = txSum / 2;
        for (unsigned int j = minBucket; j <= maxBucket; j++) {
            if (txCtAvg[j] < txSum)
                txSum -= txCtAvg[j];
            else { // we're in the right bucket
                median = m_feerate_avg[j] / txCtAvg[j];
                break;
            }
        }

        passBucket.start = minBucket ? buckets[minBucket-1] : 0;
        passBucket.end = buckets[maxBucket];
    }

    // If we were passing until we reached last few buckets with insufficient data, then report those as failed
    if (passing && !newBucketRange) {
        unsigned int failMinBucket = std::min(curNearBucket, curFarBucket);
        unsigned int failMaxBucket = std::max(curNearBucket, curFarBucket);
        failBucket.start = failMinBucket ? buckets[failMinBucket - 1] : 0;
        failBucket.end = buckets[failMaxBucket];
        failBucket.withinTarget = nConf;
        failBucket.totalConfirmed = totalNum;
        failBucket.inMempool = extraNum;
        failBucket.leftMempool = failNum;
    }

    float passed_within_target_perc = 0.0;
    float failed_within_target_perc = 0.0;
    if ((passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool)) {
        passed_within_target_perc = 100 * passBucket.withinTarget / (passBucket.totalConfirmed + passBucket.inMempool + passBucket.leftMempool);
    }
    if ((failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool)) {
        failed_within_target_perc = 100 * failBucket.withinTarget / (failBucket.totalConfirmed + failBucket.inMempool + failBucket.leftMempool);
    }

    LogDebug(BCLog::ESTIMATEFEE, "FeeEst: %d > %.0f%% decay %.5f: feerate: %g from (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out) Fail: (%g - %g) %.2f%% %.1f/(%.1f %d mem %.1f out)\n",
             confTarget, 100.0 * successBreakPoint, decay,
             median, passBucket.start, passBucket.end,
             passed_within_target_perc,
             passBucket.withinTarget, passBucket.totalConfirmed, passBucket.inMempool, passBucket.leftMempool,
             failBucket.start, failBucket.end,
             failed_within_target_perc,
             failBucket.withinTarget, failBucket.totalConfirmed, failBucket.inMempool, failBucket.leftMempool);


    if (result) {
        result->pass = passBucket;
        result->fail = failBucket;
        result->decay = decay;
        result->scale = scale;
    }
    return median;
}